

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

bool __thiscall cs::domain_manager::exist_record_in_struct(domain_manager *this,string *name)

{
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *prVar1;
  size_t sVar2;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *prVar3;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *prVar4;
  allocator local_41;
  key_arg<std::__cxx11::basic_string<char>_> local_40;
  
  prVar1 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            *)(this->m_set).m_start;
  prVar4 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            *)(this->m_set).m_current;
  do {
    prVar3 = prVar4;
    prVar4 = prVar3;
    if (prVar3 == prVar1) goto LAB_002d3c9b;
    prVar4 = prVar3 + -0x30;
    sVar2 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::count<std::__cxx11::string>(prVar4,name);
  } while (sVar2 == 0);
  std::__cxx11::string::string((string *)&local_40,"__PRAGMA_CS_STRUCT_DEFINITION__",&local_41);
  sVar2 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::count<std::__cxx11::string>(prVar4,&local_40);
  prVar4 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            *)(ulong)(sVar2 != 0);
  std::__cxx11::string::~string((string *)&local_40);
LAB_002d3c9b:
  return (bool)(prVar3 != prVar1 & (byte)prVar4);
}

Assistant:

bool exist_record_in_struct(const string &name)
		{
			for (auto &set: m_set) {
				if (set.count(name) > 0)
					return set.count("__PRAGMA_CS_STRUCT_DEFINITION__") > 0;
			}
			return false;
		}